

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandline_tests.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  UnitTestSource *pUVar4;
  UnitTest *pUVar5;
  Variable *pVVar6;
  uint uVar7;
  OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option> *in_R9;
  unsigned_long *puVar8;
  RepeatCountSet *pRVar9;
  type **in_stack_fffffffffffffd68;
  AssertionResult iutest_ar;
  iuCodeMessage local_268;
  char *targv [2];
  int targc_1;
  undefined4 uStack_214;
  pointer pbStack_210;
  pointer local_208;
  byte local_1fa;
  bool file_location_msvc;
  int targc;
  undefined4 uStack_1f4;
  string local_70 [32];
  string local_50 [32];
  
  iuutil::ReleaseDefaultXmlGenerator();
  targc = 0;
  iutest::detail::InitIrisUnitTest<char**>(&targc,(char **)0x0);
  _targc_1 = (pointer)CONCAT44(uStack_214,2);
  targv[0] = *argv;
  targv[1] = "--help";
  iutest::detail::InitIrisUnitTest<char_const**>(&targc_1,targv);
  targc = 1;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)0x129018,"targc",(char *)&targc,&targc_1,(int *)in_R9);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)&targc,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&targc);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
               ,0x37,iutest_ar.m_message._M_dataplus._M_p);
    local_268._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,(Fixed *)&targc);
    std::__cxx11::string::~string((string *)&local_268);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&targc);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  pUVar4 = iutest::UnitTestSource::GetInstance();
  iVar3 = iutest::UnitTestSource::Run(pUVar4);
  uVar7 = 1;
  if (iVar3 == 0) {
    bVar2 = iutest::TestFlag::IsEnableFlag(0x1000000);
    paVar1 = &iutest_ar.m_message.field_2;
    iutest_ar.m_message._M_string_length = 0;
    iutest_ar.m_result = !bVar2;
    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
    if (!iutest_ar.m_result) {
      memset((iu_global_format_stringstream *)&targc,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&targc);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)targv,(internal *)&iutest_ar,
                 (AssertionResult *)
                 "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP)","true","false",
                 (char *)in_R9);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_268,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                 ,0x3c,targv[0]);
      local_268._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,(Fixed *)&targc);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)targv);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&targc);
    }
    local_1fa = iVar3 != 0;
    std::__cxx11::string::~string((string *)&iutest_ar);
    _targc_1 = (pointer)CONCAT44(uStack_214,2);
    targv[0] = *argv;
    targv[1] = "--version";
    iutest::detail::InitIrisUnitTest<char_const**>(&targc_1,targv);
    targc = 1;
    iutest::internal::CmpHelperEQ<int,int>
              (&iutest_ar,(internal *)0x129018,"targc",(char *)&targc,&targc_1,(int *)in_R9);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)&targc,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&targc);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_268,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                 ,0x41,iutest_ar.m_message._M_dataplus._M_p);
      local_268._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,(Fixed *)&targc);
      std::__cxx11::string::~string((string *)&local_268);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&targc);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::TestEnv::
    OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>::
    OptionString((OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                  *)&targc);
    iutest::internal::
    CmpHelperNE<char[3],iutest::TestEnv::OptionString<&iutest::TestEnv::get_color_option,&iutest::TestEnv::set_color_option>>
              (&iutest_ar,(internal *)"\"no\"","::iutest::TestEnv::color()","no",
               (char (*) [3])&targc,in_R9);
    std::__cxx11::string::~string((string *)&targc);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)&targc,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&targc);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_268,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                 ,0x42,iutest_ar.m_message._M_dataplus._M_p);
      local_268._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,(Fixed *)&targc);
      std::__cxx11::string::~string((string *)&local_268);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&targc);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    pUVar4 = iutest::UnitTestSource::GetInstance();
    iVar3 = iutest::UnitTestSource::Run(pUVar4);
    if (iVar3 == 0) {
      bVar2 = iutest::TestFlag::IsEnableFlag(0x2000000);
      iutest_ar.m_message._M_string_length = 0;
      iutest_ar.m_result = !bVar2;
      iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
      iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
      if (bVar2) {
        memset((iu_global_format_stringstream *)&targc,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)&targc);
        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                  ((string *)targv,(internal *)&iutest_ar,
                   (AssertionResult *)
                   "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_VERSION)","true",
                   "false",(char *)in_R9);
        iutest::detail::iuCodeMessage::iuCodeMessage
                  (&local_268,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                   ,0x46,targv[0]);
        local_268._44_4_ = 1;
        iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,(Fixed *)&targc);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)targv);
        iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                  ((iu_global_format_stringstream *)&targc);
      }
      std::__cxx11::string::~string((string *)&iutest_ar);
      _targc_1 = (pointer)CONCAT44(uStack_214,2);
      targv[0] = *argv;
      targv[1] = "--feature";
      iutest::detail::InitIrisUnitTest<char_const**>(&targc_1,targv);
      targc = 1;
      iutest::internal::CmpHelperEQ<int,int>
                (&iutest_ar,(internal *)0x129018,"targc",(char *)&targc,&targc_1,(int *)in_R9);
      if (iutest_ar.m_result == false) {
        memset((iu_global_format_stringstream *)&targc,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)&targc);
        iutest::detail::iuCodeMessage::iuCodeMessage
                  (&local_268,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                   ,0x4b,iutest_ar.m_message._M_dataplus._M_p);
        local_268._44_4_ = 1;
        iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,(Fixed *)&targc);
        std::__cxx11::string::~string((string *)&local_268);
        iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                  ((iu_global_format_stringstream *)&targc);
      }
      std::__cxx11::string::~string((string *)&iutest_ar);
      pUVar4 = iutest::UnitTestSource::GetInstance();
      iVar3 = iutest::UnitTestSource::Run(pUVar4);
      if (iVar3 == 0) {
        bVar2 = iutest::TestFlag::IsEnableFlag(0x4000000);
        iutest_ar.m_message._M_string_length = 0;
        iutest_ar.m_result = !bVar2;
        iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
        iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
        if (!iutest_ar.m_result) {
          memset((iu_global_format_stringstream *)&targc,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                    ((iu_global_format_stringstream *)&targc);
          iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                    ((string *)targv,(internal *)&iutest_ar,
                     (AssertionResult *)
                     "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE)","true",
                     "false",(char *)in_R9);
          iutest::detail::iuCodeMessage::iuCodeMessage
                    (&local_268,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                     ,0x4f,targv[0]);
          local_268._44_4_ = 1;
          iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,(Fixed *)&targc);
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::~string((string *)targv);
          iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                    ((iu_global_format_stringstream *)&targc);
        }
        std::__cxx11::string::~string((string *)&iutest_ar);
        _targc_1 = (pointer)CONCAT44(uStack_214,2);
        targv[0] = *argv;
        targv[1] = "--spec";
        iutest::detail::InitIrisUnitTest<char_const**>(&targc_1,targv);
        targc = 1;
        iutest::internal::CmpHelperEQ<int,int>
                  (&iutest_ar,(internal *)0x129018,"targc",(char *)&targc,&targc_1,(int *)in_R9);
        if (iutest_ar.m_result == false) {
          memset((iu_global_format_stringstream *)&targc,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                    ((iu_global_format_stringstream *)&targc);
          iutest::detail::iuCodeMessage::iuCodeMessage
                    (&local_268,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                     ,0x54,iutest_ar.m_message._M_dataplus._M_p);
          local_268._44_4_ = 1;
          iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,(Fixed *)&targc);
          std::__cxx11::string::~string((string *)&local_268);
          iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                    ((iu_global_format_stringstream *)&targc);
        }
        std::__cxx11::string::~string((string *)&iutest_ar);
        pUVar4 = iutest::UnitTestSource::GetInstance();
        iVar3 = iutest::UnitTestSource::Run(pUVar4);
        if (iVar3 == 0) {
          bVar2 = iutest::TestFlag::IsEnableFlag(0x8000000);
          iutest_ar.m_message._M_string_length = 0;
          iutest_ar.m_result = !bVar2;
          iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
          iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
          if (!iutest_ar.m_result) {
            memset((iu_global_format_stringstream *)&targc,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      ((iu_global_format_stringstream *)&targc);
            iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                      ((string *)targv,(internal *)&iutest_ar,
                       (AssertionResult *)
                       "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_SPEC)","true",
                       "false",(char *)in_R9);
            iutest::detail::iuCodeMessage::iuCodeMessage
                      (&local_268,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                       ,0x58,targv[0]);
            local_268._44_4_ = 1;
            iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,(Fixed *)&targc);
            std::__cxx11::string::~string((string *)&local_268);
            std::__cxx11::string::~string((string *)targv);
            iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                      ((iu_global_format_stringstream *)&targc);
          }
          std::__cxx11::string::~string((string *)&iutest_ar);
          _targc_1 = (pointer)CONCAT44(uStack_214,4);
          targv[0] = *argv;
          targv[1] = "test1";
          iutest::detail::InitIrisUnitTest<char_const**>(&targc_1,targv);
          targc = 3;
          iutest::internal::CmpHelperEQ<int,int>
                    (&iutest_ar,(internal *)"3","targc",(char *)&targc,&targc_1,(int *)in_R9);
          if (iutest_ar.m_result == false) {
            memset((iu_global_format_stringstream *)&targc,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      ((iu_global_format_stringstream *)&targc);
            iutest::detail::iuCodeMessage::iuCodeMessage
                      (&local_268,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                       ,0x5c,iutest_ar.m_message._M_dataplus._M_p);
            local_268._44_4_ = 1;
            iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,(Fixed *)&targc);
            std::__cxx11::string::~string((string *)&local_268);
            iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                      ((iu_global_format_stringstream *)&targc);
          }
          std::__cxx11::string::~string((string *)&iutest_ar);
          iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                    (&iutest_ar,(internal *)"\"test1\"","targv[1]","test1",targv[1],
                     (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffd68);
          if (iutest_ar.m_result == false) {
            memset((iu_global_format_stringstream *)&targc,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      ((iu_global_format_stringstream *)&targc);
            iutest::detail::iuCodeMessage::iuCodeMessage
                      (&local_268,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                       ,0x5d,iutest_ar.m_message._M_dataplus._M_p);
            local_268._44_4_ = 1;
            iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,(Fixed *)&targc);
            std::__cxx11::string::~string((string *)&local_268);
            iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                      ((iu_global_format_stringstream *)&targc);
          }
          std::__cxx11::string::~string((string *)&iutest_ar);
          puVar8 = &iutest_type_traits::enabler_t<void>::value;
          iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                    (&iutest_ar,(internal *)"\"test2\"","targv[2]","test2","-v",
                     (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffd68);
          if (iutest_ar.m_result == false) {
            memset((iu_global_format_stringstream *)&targc,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      ((iu_global_format_stringstream *)&targc);
            iutest::detail::iuCodeMessage::iuCodeMessage
                      (&local_268,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                       ,0x5e,iutest_ar.m_message._M_dataplus._M_p);
            local_268._44_4_ = 1;
            iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,(Fixed *)&targc);
            std::__cxx11::string::~string((string *)&local_268);
            iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                      ((iu_global_format_stringstream *)&targc);
          }
          std::__cxx11::string::~string((string *)&iutest_ar);
          pUVar4 = iutest::UnitTestSource::GetInstance();
          iVar3 = iutest::UnitTestSource::Run(pUVar4);
          if (iVar3 == 0) {
            targv[0] = (char *)0x0;
            targv[1] = (char *)0x0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&targc,"test1",(allocator<char> *)&local_268);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targv,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targc);
            std::__cxx11::string::~string((string *)&targc);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&targc,"-v",(allocator<char> *)&local_268);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targv,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targc);
            std::__cxx11::string::~string((string *)&targc);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&targc,"test2",(allocator<char> *)&local_268);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targv,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targc);
            std::__cxx11::string::~string((string *)&targc);
            iutest::InitIrisUnitTest<char>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)targv);
            local_268.m_message._M_dataplus._M_p._0_4_ = 2;
            _targc = (pointer)((long)targv[1] - (long)targv[0] >> 5);
            iutest::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                      (&iutest_ar,(internal *)"2u","vargv.size()",(char *)&local_268,(uint *)&targc,
                       puVar8);
            if (iutest_ar.m_result == false) {
              memset((iu_global_format_stringstream *)&targc,0,0x188);
              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                        ((iu_global_format_stringstream *)&targc);
              iutest::detail::iuCodeMessage::iuCodeMessage
                        (&local_268,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                         ,0x67,iutest_ar.m_message._M_dataplus._M_p);
              local_268._44_4_ = 1;
              iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,(Fixed *)&targc);
              std::__cxx11::string::~string((string *)&local_268);
              iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                        ((iu_global_format_stringstream *)&targc);
            }
            std::__cxx11::string::~string((string *)&iutest_ar);
            std::__cxx11::string::string(local_50,(string *)targv[0]);
            iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
                      (&iutest_ar,(internal *)"\"test1\"","vargv[0]","test1",(char *)local_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffd68);
            std::__cxx11::string::~string(local_50);
            if (iutest_ar.m_result == false) {
              memset((iu_global_format_stringstream *)&targc,0,0x188);
              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                        ((iu_global_format_stringstream *)&targc);
              iutest::detail::iuCodeMessage::iuCodeMessage
                        (&local_268,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                         ,0x68,iutest_ar.m_message._M_dataplus._M_p);
              local_268._44_4_ = 1;
              iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,(Fixed *)&targc);
              std::__cxx11::string::~string((string *)&local_268);
              iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                        ((iu_global_format_stringstream *)&targc);
            }
            std::__cxx11::string::~string((string *)&iutest_ar);
            std::__cxx11::string::string(local_70,(string *)(targv[0] + 0x20));
            puVar8 = &iutest_type_traits::enabler_t<void>::value;
            iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
                      (&iutest_ar,(internal *)"\"test2\"","vargv[1]","test2",(char *)local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffd68);
            std::__cxx11::string::~string(local_70);
            if (iutest_ar.m_result == false) {
              memset((iu_global_format_stringstream *)&targc,0,0x188);
              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                        ((iu_global_format_stringstream *)&targc);
              iutest::detail::iuCodeMessage::iuCodeMessage
                        (&local_268,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                         ,0x69,iutest_ar.m_message._M_dataplus._M_p);
              local_268._44_4_ = 1;
              iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,(Fixed *)&targc);
              std::__cxx11::string::~string((string *)&local_268);
              iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                        ((iu_global_format_stringstream *)&targc);
            }
            std::__cxx11::string::~string((string *)&iutest_ar);
            pUVar4 = iutest::UnitTestSource::GetInstance();
            iVar3 = iutest::UnitTestSource::Run(pUVar4);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)targv);
            if (iVar3 == 0) {
              bVar2 = iutest::TestFlag::IsEnableFlag(0x2000000);
              iutest_ar.m_message._M_string_length = 0;
              iutest_ar.m_result = !bVar2;
              iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
              iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
              if (bVar2) {
                memset((iu_global_format_stringstream *)&targc,0,0x188);
                iutest::iu_global_format_stringstream::iu_global_format_stringstream
                          ((iu_global_format_stringstream *)&targc);
                iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                          ((string *)targv,(internal *)&iutest_ar,
                           (AssertionResult *)
                           "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_VERSION)",
                           "true","false",(char *)puVar8);
                iutest::detail::iuCodeMessage::iuCodeMessage
                          (&local_268,
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                           ,0x6e,targv[0]);
                local_268._44_4_ = 1;
                iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,(Fixed *)&targc);
                std::__cxx11::string::~string((string *)&local_268);
                std::__cxx11::string::~string((string *)targv);
                iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                          ((iu_global_format_stringstream *)&targc);
              }
              std::__cxx11::string::~string((string *)&iutest_ar);
              _targc_1 = (pointer)CONCAT44(uStack_214,2);
              targv[0] = *argv;
              targv[1] = "-h";
              iutest::detail::InitIrisUnitTest<char_const**>(&targc_1,targv);
              targc = 1;
              iutest::internal::CmpHelperEQ<int,int>
                        (&iutest_ar,(internal *)0x129018,"targc",(char *)&targc,&targc_1,
                         (int *)puVar8);
              if (iutest_ar.m_result == false) {
                memset((iu_global_format_stringstream *)&targc,0,0x188);
                iutest::iu_global_format_stringstream::iu_global_format_stringstream
                          ((iu_global_format_stringstream *)&targc);
                iutest::detail::iuCodeMessage::iuCodeMessage
                          (&local_268,
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                           ,0x73,iutest_ar.m_message._M_dataplus._M_p);
                local_268._44_4_ = 1;
                iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,(Fixed *)&targc);
                std::__cxx11::string::~string((string *)&local_268);
                iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                          ((iu_global_format_stringstream *)&targc);
              }
              std::__cxx11::string::~string((string *)&iutest_ar);
              pUVar4 = iutest::UnitTestSource::GetInstance();
              iVar3 = iutest::UnitTestSource::Run(pUVar4);
              if (iVar3 == 0) {
                bVar2 = iutest::TestFlag::IsEnableFlag(0x1000000);
                iutest_ar.m_message._M_string_length = 0;
                iutest_ar.m_result = !bVar2;
                iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
                iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
                if (!iutest_ar.m_result) {
                  memset((iu_global_format_stringstream *)&targc,0,0x188);
                  iutest::iu_global_format_stringstream::iu_global_format_stringstream
                            ((iu_global_format_stringstream *)&targc);
                  iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                            ((string *)targv,(internal *)&iutest_ar,
                             (AssertionResult *)
                             "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP)",
                             "true","false",(char *)puVar8);
                  iutest::detail::iuCodeMessage::iuCodeMessage
                            (&local_268,
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                             ,0x77,targv[0]);
                  local_268._44_4_ = 1;
                  iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,(Fixed *)&targc);
                  std::__cxx11::string::~string((string *)&local_268);
                  std::__cxx11::string::~string((string *)targv);
                  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                            ((iu_global_format_stringstream *)&targc);
                }
                std::__cxx11::string::~string((string *)&iutest_ar);
                _targc_1 = (pointer)CONCAT44(uStack_214,2);
                targv[0] = *argv;
                targv[1] = "-?";
                iutest::detail::InitIrisUnitTest<char_const**>(&targc_1,targv);
                targc = 1;
                iutest::internal::CmpHelperEQ<int,int>
                          (&iutest_ar,(internal *)0x129018,"targc",(char *)&targc,&targc_1,
                           (int *)puVar8);
                if (iutest_ar.m_result == false) {
                  memset((iu_global_format_stringstream *)&targc,0,0x188);
                  iutest::iu_global_format_stringstream::iu_global_format_stringstream
                            ((iu_global_format_stringstream *)&targc);
                  iutest::detail::iuCodeMessage::iuCodeMessage
                            (&local_268,
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                             ,0x7c,iutest_ar.m_message._M_dataplus._M_p);
                  local_268._44_4_ = 1;
                  iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,(Fixed *)&targc);
                  std::__cxx11::string::~string((string *)&local_268);
                  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                            ((iu_global_format_stringstream *)&targc);
                }
                std::__cxx11::string::~string((string *)&iutest_ar);
                pUVar4 = iutest::UnitTestSource::GetInstance();
                iVar3 = iutest::UnitTestSource::Run(pUVar4);
                if (iVar3 == 0) {
                  file_location_msvc = iutest::TestFlag::IsEnableFlag(0x2000);
                  iutest::TestFlag::Fragment<8192>::operator=
                            ((Fragment<8192> *)&targc,!file_location_msvc);
                  _targc_1 = (pointer)0x0;
                  pbStack_210 = (pointer)0x0;
                  local_208 = (pointer)0x0;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&targc,"--iutest_break_on_failure",
                             (allocator<char> *)&local_268);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &targc_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&targc);
                  std::__cxx11::string::~string((string *)&targc);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&targc,"--iutest_throw_on_failure",
                             (allocator<char> *)&local_268);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &targc_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&targc);
                  std::__cxx11::string::~string((string *)&targc);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&targc,"--iutest_filter",(allocator<char> *)&local_268);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &targc_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&targc);
                  std::__cxx11::string::~string((string *)&targc);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&targc,"--iutest_file_location=auto",
                             (allocator<char> *)&local_268);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &targc_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&targc);
                  std::__cxx11::string::~string((string *)&targc);
                  iutest::InitIrisUnitTest<char>
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&targc_1);
                  local_268.m_message._M_dataplus._M_p._0_4_ = 0;
                  _targc = (pointer)((long)pbStack_210 - (long)_targc_1 >> 5);
                  iutest::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                            (&iutest_ar,(internal *)0x12764e,"vargv.size()",(char *)&local_268,
                             (uint *)&targc,puVar8);
                  if (iutest_ar.m_result == false) {
                    memset((iu_global_format_stringstream *)&targc,0,0x188);
                    iutest::iu_global_format_stringstream::iu_global_format_stringstream
                              ((iu_global_format_stringstream *)&targc);
                    iutest::detail::iuCodeMessage::iuCodeMessage
                              (&local_268,
                               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                               ,0x8a,iutest_ar.m_message._M_dataplus._M_p);
                    local_268._44_4_ = 1;
                    iutest::AssertionHelper::operator=
                              ((AssertionHelper *)&local_268,(Fixed *)&targc);
                    std::__cxx11::string::~string((string *)&local_268);
                    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                              ((iu_global_format_stringstream *)&targc);
                  }
                  std::__cxx11::string::~string((string *)&iutest_ar);
                  iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(0x10);
                  iutest_ar.m_message._M_string_length = 0;
                  iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
                  iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
                  if (!iutest_ar.m_result) {
                    memset((iu_global_format_stringstream *)&targc,0,0x188);
                    iutest::iu_global_format_stringstream::iu_global_format_stringstream
                              ((iu_global_format_stringstream *)&targc);
                    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                              ((string *)targv,(internal *)&iutest_ar,
                               (AssertionResult *)"IUTEST_FLAG_GET(break_on_failure)","false","true"
                               ,(char *)puVar8);
                    iutest::detail::iuCodeMessage::iuCodeMessage
                              (&local_268,
                               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                               ,0x8c,targv[0]);
                    local_268._44_4_ = 1;
                    iutest::AssertionHelper::operator=
                              ((AssertionHelper *)&local_268,(Fixed *)&targc);
                    std::__cxx11::string::~string((string *)&local_268);
                    std::__cxx11::string::~string((string *)targv);
                    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                              ((iu_global_format_stringstream *)&targc);
                  }
                  std::__cxx11::string::~string((string *)&iutest_ar);
                  iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(0x40);
                  iutest_ar.m_message._M_string_length = 0;
                  iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
                  iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
                  if (!iutest_ar.m_result) {
                    memset((iu_global_format_stringstream *)&targc,0,0x188);
                    iutest::iu_global_format_stringstream::iu_global_format_stringstream
                              ((iu_global_format_stringstream *)&targc);
                    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                              ((string *)targv,(internal *)&iutest_ar,
                               (AssertionResult *)"IUTEST_FLAG_GET(throw_on_failure)","false","true"
                               ,(char *)puVar8);
                    iutest::detail::iuCodeMessage::iuCodeMessage
                              (&local_268,
                               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                               ,0x8d,targv[0]);
                    local_268._44_4_ = 1;
                    iutest::AssertionHelper::operator=
                              ((AssertionHelper *)&local_268,(Fixed *)&targc);
                    std::__cxx11::string::~string((string *)&local_268);
                    std::__cxx11::string::~string((string *)targv);
                    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                              ((iu_global_format_stringstream *)&targc);
                  }
                  std::__cxx11::string::~string((string *)&iutest_ar);
                  iutest::TestEnv::
                  OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::
                  OptionString((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                                *)&targc);
                  pRVar9 = (RepeatCountSet *)&iutest_type_traits::enabler_t<void>::value;
                  iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                            (&iutest_ar,(internal *)"\"*\"","::iutest::TestEnv::filter().c_str()",
                             "*",_targc,(char *)&iutest_type_traits::enabler_t<void>::value,
                             in_stack_fffffffffffffd68);
                  std::__cxx11::string::~string((string *)&targc);
                  if (iutest_ar.m_result == false) {
                    memset((iu_global_format_stringstream *)&targc,0,0x188);
                    iutest::iu_global_format_stringstream::iu_global_format_stringstream
                              ((iu_global_format_stringstream *)&targc);
                    iutest::detail::iuCodeMessage::iuCodeMessage
                              (&local_268,
                               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                               ,0x8e,iutest_ar.m_message._M_dataplus._M_p);
                    local_268._44_4_ = 1;
                    iutest::AssertionHelper::operator=
                              ((AssertionHelper *)&local_268,(Fixed *)&targc);
                    std::__cxx11::string::~string((string *)&local_268);
                    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                              ((iu_global_format_stringstream *)&targc);
                  }
                  std::__cxx11::string::~string((string *)&iutest_ar);
                  iutest::internal::CmpHelperEQ<bool,iutest::TestFlag::Fragment<8192>>
                            (&iutest_ar,(internal *)"file_location_msvc",
                             "::iutest::TestEnv::file_location_style_msvc()",&file_location_msvc,
                             (bool *)&targc,(Fragment<8192> *)pRVar9);
                  if (iutest_ar.m_result == false) {
                    memset((iu_global_format_stringstream *)&targc,0,0x188);
                    iutest::iu_global_format_stringstream::iu_global_format_stringstream
                              ((iu_global_format_stringstream *)&targc);
                    iutest::detail::iuCodeMessage::iuCodeMessage
                              (&local_268,
                               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                               ,0x8f,iutest_ar.m_message._M_dataplus._M_p);
                    local_268._44_4_ = 1;
                    iutest::AssertionHelper::operator=
                              ((AssertionHelper *)&local_268,(Fixed *)&targc);
                    std::__cxx11::string::~string((string *)&local_268);
                    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                              ((iu_global_format_stringstream *)&targc);
                  }
                  std::__cxx11::string::~string((string *)&iutest_ar);
                  pUVar5 = iutest::UnitTest::instance();
                  bVar2 = iutest::UnitTest::Failed(pUVar5);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&targc_1);
                  if (!bVar2) {
                    bVar2 = iutest::TestFlag::IsEnableFlag(0x1000000);
                    iutest_ar.m_message._M_string_length = 0;
                    iutest_ar.m_result = !bVar2;
                    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
                    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (bVar2) {
                      memset((iu_global_format_stringstream *)&targc,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)targv,(internal *)&iutest_ar,
                                 (AssertionResult *)
                                 "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP)",
                                 "true","false",(char *)pRVar9);
                      iutest::detail::iuCodeMessage::iuCodeMessage
                                (&local_268,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0x95,targv[0]);
                      local_268._44_4_ = 1;
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&local_268,(Fixed *)&targc);
                      std::__cxx11::string::~string((string *)&local_268);
                      std::__cxx11::string::~string((string *)targv);
                      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                    }
                    std::__cxx11::string::~string((string *)&iutest_ar);
                    bVar2 = iutest::TestFlag::IsEnableFlag(0x4000000);
                    iutest_ar.m_message._M_string_length = 0;
                    iutest_ar.m_result = !bVar2;
                    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
                    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (!iutest_ar.m_result) {
                      memset((iu_global_format_stringstream *)&targc,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)targv,(internal *)&iutest_ar,
                                 (AssertionResult *)
                                 "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE)"
                                 ,"true","false",(char *)pRVar9);
                      iutest::detail::iuCodeMessage::iuCodeMessage
                                (&local_268,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0x96,targv[0]);
                      local_268._44_4_ = 1;
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&local_268,(Fixed *)&targc);
                      std::__cxx11::string::~string((string *)&local_268);
                      std::__cxx11::string::~string((string *)targv);
                      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                    }
                    std::__cxx11::string::~string((string *)&iutest_ar);
                    bVar2 = iutest::TestFlag::IsEnableFlag(0x2000000);
                    iutest_ar.m_message._M_string_length = 0;
                    iutest_ar.m_result = !bVar2;
                    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
                    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (!iutest_ar.m_result) {
                      memset((iu_global_format_stringstream *)&targc,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)targv,(internal *)&iutest_ar,
                                 (AssertionResult *)
                                 "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_VERSION)"
                                 ,"true","false",(char *)pRVar9);
                      iutest::detail::iuCodeMessage::iuCodeMessage
                                (&local_268,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0x97,targv[0]);
                      local_268._44_4_ = 1;
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&local_268,(Fixed *)&targc);
                      std::__cxx11::string::~string((string *)&local_268);
                      std::__cxx11::string::~string((string *)targv);
                      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                    }
                    std::__cxx11::string::~string((string *)&iutest_ar);
                    _targc_1 = (pointer)0x0;
                    pbStack_210 = (pointer)0x0;
                    local_208 = (pointer)0x0;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&targc,"--iutest_break_on_failure=1",
                               (allocator<char> *)&local_268);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &targc_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&targc);
                    std::__cxx11::string::~string((string *)&targc);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&targc,"--iutest_throw_on_failure=t",
                               (allocator<char> *)&local_268);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &targc_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&targc);
                    std::__cxx11::string::~string((string *)&targc);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&targc,"--iutest_also_run_disabled_tests",
                               (allocator<char> *)&local_268);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &targc_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&targc);
                    std::__cxx11::string::~string((string *)&targc);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&targc,"--iutest_catch_exceptions=yes",
                               (allocator<char> *)&local_268);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &targc_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&targc);
                    std::__cxx11::string::~string((string *)&targc);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&targc,"--iutest_print_time=n",
                               (allocator<char> *)&local_268);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &targc_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&targc);
                    std::__cxx11::string::~string((string *)&targc);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&targc,"--iutest_shuffle",(allocator<char> *)&local_268);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &targc_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&targc);
                    std::__cxx11::string::~string((string *)&targc);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&targc,"--iutest_color=ansi",(allocator<char> *)&local_268)
                    ;
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &targc_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&targc);
                    std::__cxx11::string::~string((string *)&targc);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&targc,"--iutest_file_location=vs",
                               (allocator<char> *)&local_268);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &targc_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&targc);
                    std::__cxx11::string::~string((string *)&targc);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&targc,"--iutest_random_seed=200",
                               (allocator<char> *)&local_268);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &targc_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&targc);
                    std::__cxx11::string::~string((string *)&targc);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&targc,"--iutest_repeat=2",(allocator<char> *)&local_268);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &targc_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&targc);
                    std::__cxx11::string::~string((string *)&targc);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&targc,"--iutest_filter=Flag*",
                               (allocator<char> *)&local_268);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &targc_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&targc);
                    std::__cxx11::string::~string((string *)&targc);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&targc,"--iutest_default_package_name=root",
                               (allocator<char> *)&local_268);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &targc_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&targc);
                    std::__cxx11::string::~string((string *)&targc);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&targc,"--iutest_warning_into_error=t",
                               (allocator<char> *)&local_268);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &targc_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&targc);
                    std::__cxx11::string::~string((string *)&targc);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&targc,"--iutest_locale_ctype=C",
                               (allocator<char> *)&local_268);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &targc_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&targc);
                    std::__cxx11::string::~string((string *)&targc);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&targc,"--iutest_stream_result_to=test",
                               (allocator<char> *)&local_268);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &targc_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&targc);
                    std::__cxx11::string::~string((string *)&targc);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&targc,"--verbose",(allocator<char> *)&local_268);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &targc_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&targc);
                    std::__cxx11::string::~string((string *)&targc);
                    iutest::InitIrisUnitTest<char>
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&targc_1);
                    local_268.m_message._M_dataplus._M_p._0_4_ = 0;
                    _targc = (pointer)((long)pbStack_210 - (long)_targc_1 >> 5);
                    iutest::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                              (&iutest_ar,(internal *)0x12764e,"vargv.size()",(char *)&local_268,
                               (uint *)&targc,(unsigned_long *)pRVar9);
                    if (iutest_ar.m_result == false) {
                      memset((iu_global_format_stringstream *)&targc,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                      iutest::detail::iuCodeMessage::iuCodeMessage
                                (&local_268,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xae,iutest_ar.m_message._M_dataplus._M_p);
                      local_268._44_4_ = 1;
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&local_268,(Fixed *)&targc);
                      std::__cxx11::string::~string((string *)&local_268);
                      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                    }
                    std::__cxx11::string::~string((string *)&iutest_ar);
                    iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(2);
                    iutest_ar.m_message._M_string_length = 0;
                    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
                    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (!iutest_ar.m_result) {
                      memset((iu_global_format_stringstream *)&targc,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)targv,(internal *)&iutest_ar,
                                 (AssertionResult *)"IUTEST_FLAG_GET(also_run_disabled_tests)",
                                 "false","true",(char *)pRVar9);
                      iutest::detail::iuCodeMessage::iuCodeMessage
                                (&local_268,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xb0,targv[0]);
                      local_268._44_4_ = 1;
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&local_268,(Fixed *)&targc);
                      std::__cxx11::string::~string((string *)&local_268);
                      std::__cxx11::string::~string((string *)targv);
                      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                    }
                    std::__cxx11::string::~string((string *)&iutest_ar);
                    iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(0x10);
                    iutest_ar.m_message._M_string_length = 0;
                    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
                    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (!iutest_ar.m_result) {
                      memset((iu_global_format_stringstream *)&targc,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)targv,(internal *)&iutest_ar,
                                 (AssertionResult *)"IUTEST_FLAG_GET(break_on_failure)","false",
                                 "true",(char *)pRVar9);
                      iutest::detail::iuCodeMessage::iuCodeMessage
                                (&local_268,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xb1,targv[0]);
                      local_268._44_4_ = 1;
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&local_268,(Fixed *)&targc);
                      std::__cxx11::string::~string((string *)&local_268);
                      std::__cxx11::string::~string((string *)targv);
                      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                    }
                    std::__cxx11::string::~string((string *)&iutest_ar);
                    iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(0x40);
                    iutest_ar.m_message._M_string_length = 0;
                    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
                    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (!iutest_ar.m_result) {
                      memset((iu_global_format_stringstream *)&targc,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)targv,(internal *)&iutest_ar,
                                 (AssertionResult *)"IUTEST_FLAG_GET(throw_on_failure)","false",
                                 "true",(char *)pRVar9);
                      iutest::detail::iuCodeMessage::iuCodeMessage
                                (&local_268,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xb2,targv[0]);
                      local_268._44_4_ = 1;
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&local_268,(Fixed *)&targc);
                      std::__cxx11::string::~string((string *)&local_268);
                      std::__cxx11::string::~string((string *)targv);
                      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                    }
                    std::__cxx11::string::~string((string *)&iutest_ar);
                    iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(0x30000);
                    iutest_ar.m_message._M_string_length = 0;
                    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
                    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (!iutest_ar.m_result) {
                      memset((iu_global_format_stringstream *)&targc,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)targv,(internal *)&iutest_ar,
                                 (AssertionResult *)"IUTEST_FLAG_GET(catch_exceptions)","false",
                                 "true",(char *)pRVar9);
                      iutest::detail::iuCodeMessage::iuCodeMessage
                                (&local_268,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xb3,targv[0]);
                      local_268._44_4_ = 1;
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&local_268,(Fixed *)&targc);
                      std::__cxx11::string::~string((string *)&local_268);
                      std::__cxx11::string::~string((string *)targv);
                      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                    }
                    std::__cxx11::string::~string((string *)&iutest_ar);
                    bVar2 = iutest::TestFlag::IsEnableFlag(0x1000);
                    iutest_ar.m_message._M_string_length = 0;
                    iutest_ar.m_result = !bVar2;
                    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
                    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (bVar2) {
                      memset((iu_global_format_stringstream *)&targc,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)targv,(internal *)&iutest_ar,
                                 (AssertionResult *)"IUTEST_FLAG_GET(print_time)","true","false",
                                 (char *)pRVar9);
                      iutest::detail::iuCodeMessage::iuCodeMessage
                                (&local_268,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xb4,targv[0]);
                      local_268._44_4_ = 1;
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&local_268,(Fixed *)&targc);
                      std::__cxx11::string::~string((string *)&local_268);
                      std::__cxx11::string::~string((string *)targv);
                      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                    }
                    std::__cxx11::string::~string((string *)&iutest_ar);
                    uVar7 = 1;
                    iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(1);
                    iutest_ar.m_message._M_string_length = 0;
                    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
                    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (!iutest_ar.m_result) {
                      memset((iu_global_format_stringstream *)&targc,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)targv,(internal *)&iutest_ar,
                                 (AssertionResult *)"IUTEST_FLAG_GET(shuffle)","false","true",
                                 (char *)pRVar9);
                      iutest::detail::iuCodeMessage::iuCodeMessage
                                (&local_268,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xb5,targv[0]);
                      local_268._44_4_ = 1;
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&local_268,(Fixed *)&targc);
                      std::__cxx11::string::~string((string *)&local_268);
                      std::__cxx11::string::~string((string *)targv);
                      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                    }
                    std::__cxx11::string::~string((string *)&iutest_ar);
                    iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(0x2000);
                    iutest_ar.m_message._M_string_length = 0;
                    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
                    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (!iutest_ar.m_result) {
                      memset((iu_global_format_stringstream *)&targc,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)targv,(internal *)&iutest_ar,
                                 (AssertionResult *)"IUTEST_FLAG_GET(file_location_style_msvc)",
                                 "false","true",(char *)pRVar9);
                      iutest::detail::iuCodeMessage::iuCodeMessage
                                (&local_268,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xb6,targv[0]);
                      local_268._44_4_ = 1;
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&local_268,(Fixed *)&targc);
                      std::__cxx11::string::~string((string *)&local_268);
                      std::__cxx11::string::~string((string *)targv);
                      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                    }
                    std::__cxx11::string::~string((string *)&iutest_ar);
                    iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(0x80);
                    iutest_ar.m_message._M_string_length = 0;
                    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
                    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (!iutest_ar.m_result) {
                      memset((iu_global_format_stringstream *)&targc,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)targv,(internal *)&iutest_ar,
                                 (AssertionResult *)"IUTEST_FLAG_GET(warning_into_error)","false",
                                 "true",(char *)pRVar9);
                      iutest::detail::iuCodeMessage::iuCodeMessage
                                (&local_268,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xb7,targv[0]);
                      local_268._44_4_ = 1;
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&local_268,(Fixed *)&targc);
                      std::__cxx11::string::~string((string *)&local_268);
                      std::__cxx11::string::~string((string *)targv);
                      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                    }
                    std::__cxx11::string::~string((string *)&iutest_ar);
                    targc = 200;
                    iutest::internal::CmpHelperEQ<unsigned_int,iutest::TestEnv::RandomSeedSet>
                              (&iutest_ar,(internal *)"200u","::iutest::TestEnv::random_seed()",
                               (char *)&targc,(uint *)&local_268,(RandomSeedSet *)pRVar9);
                    if (iutest_ar.m_result == false) {
                      memset((iu_global_format_stringstream *)&targc,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                      iutest::detail::iuCodeMessage::iuCodeMessage
                                (&local_268,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xb9,iutest_ar.m_message._M_dataplus._M_p);
                      local_268._44_4_ = 1;
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&local_268,(Fixed *)&targc);
                      std::__cxx11::string::~string((string *)&local_268);
                      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                    }
                    std::__cxx11::string::~string((string *)&iutest_ar);
                    targc = 2;
                    iutest::internal::CmpHelperEQ<int,iutest::TestEnv::RepeatCountSet>
                              (&iutest_ar,(internal *)0x127886,"::iutest::TestEnv::repeat()",
                               (char *)&targc,(int *)&local_268,pRVar9);
                    if (iutest_ar.m_result == false) {
                      memset((iu_global_format_stringstream *)&targc,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                      iutest::detail::iuCodeMessage::iuCodeMessage
                                (&local_268,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xba,iutest_ar.m_message._M_dataplus._M_p);
                      local_268._44_4_ = 1;
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&local_268,(Fixed *)&targc);
                      std::__cxx11::string::~string((string *)&local_268);
                      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                    }
                    std::__cxx11::string::~string((string *)&iutest_ar);
                    iutest::TestEnv::
                    OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                    ::OptionString((OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                                    *)&targc);
                    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                              (&iutest_ar,(internal *)"\"ansi\"",
                               "::iutest::TestEnv::color().c_str()","ansi",_targc,
                               (char *)&iutest_type_traits::enabler_t<void>::value,
                               in_stack_fffffffffffffd68);
                    std::__cxx11::string::~string((string *)&targc);
                    if (iutest_ar.m_result == false) {
                      memset((iu_global_format_stringstream *)&targc,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                      iutest::detail::iuCodeMessage::iuCodeMessage
                                (&local_268,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xbc,iutest_ar.m_message._M_dataplus._M_p);
                      local_268._44_4_ = 1;
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&local_268,(Fixed *)&targc);
                      std::__cxx11::string::~string((string *)&local_268);
                      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                    }
                    std::__cxx11::string::~string((string *)&iutest_ar);
                    iutest::TestEnv::
                    OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::
                    OptionString((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                                  *)&targc);
                    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                              (&iutest_ar,(internal *)"\"Flag*\"",
                               "::iutest::TestEnv::filter().c_str()","Flag*",_targc,
                               (char *)&iutest_type_traits::enabler_t<void>::value,
                               in_stack_fffffffffffffd68);
                    std::__cxx11::string::~string((string *)&targc);
                    if (iutest_ar.m_result == false) {
                      memset((iu_global_format_stringstream *)&targc,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                      iutest::detail::iuCodeMessage::iuCodeMessage
                                (&local_268,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xbd,iutest_ar.m_message._M_dataplus._M_p);
                      local_268._44_4_ = 1;
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&local_268,(Fixed *)&targc);
                      std::__cxx11::string::~string((string *)&local_268);
                      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                    }
                    std::__cxx11::string::~string((string *)&iutest_ar);
                    iutest::TestEnv::
                    OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
                    ::OptionString((OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
                                    *)&targc);
                    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                              (&iutest_ar,(internal *)"\"root\"",
                               "::iutest::TestEnv::default_package_name().c_str()","root",_targc,
                               (char *)&iutest_type_traits::enabler_t<void>::value,
                               in_stack_fffffffffffffd68);
                    std::__cxx11::string::~string((string *)&targc);
                    if (iutest_ar.m_result == false) {
                      memset((iu_global_format_stringstream *)&targc,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                      iutest::detail::iuCodeMessage::iuCodeMessage
                                (&local_268,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xbe,iutest_ar.m_message._M_dataplus._M_p);
                      local_268._44_4_ = 1;
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&local_268,(Fixed *)&targc);
                      std::__cxx11::string::~string((string *)&local_268);
                      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                    }
                    std::__cxx11::string::~string((string *)&iutest_ar);
                    iutest::TestEnv::
                    OptionString<&iutest::TestEnv::get_locale_ctype,_&iutest::TestEnv::set_locale_ctype>
                    ::OptionString((OptionString<&iutest::TestEnv::get_locale_ctype,_&iutest::TestEnv::set_locale_ctype>
                                    *)&targc);
                    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                              (&iutest_ar,(internal *)"\"C\"",
                               "::iutest::TestEnv::locale_ctype().c_str()","C",_targc,
                               (char *)&iutest_type_traits::enabler_t<void>::value,
                               in_stack_fffffffffffffd68);
                    std::__cxx11::string::~string((string *)&targc);
                    if (iutest_ar.m_result == false) {
                      memset((iu_global_format_stringstream *)&targc,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                      iutest::detail::iuCodeMessage::iuCodeMessage
                                (&local_268,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xbf,iutest_ar.m_message._M_dataplus._M_p);
                      local_268._44_4_ = 1;
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&local_268,(Fixed *)&targc);
                      std::__cxx11::string::~string((string *)&local_268);
                      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                    }
                    std::__cxx11::string::~string((string *)&iutest_ar);
                    iutest::TestEnv::
                    OptionString<&iutest::TestEnv::get_stream_result_to_c_str,_&iutest::TestEnv::set_stream_result_to>
                    ::OptionString((OptionString<&iutest::TestEnv::get_stream_result_to_c_str,_&iutest::TestEnv::set_stream_result_to>
                                    *)&targc);
                    pRVar9 = (RepeatCountSet *)&iutest_type_traits::enabler_t<void>::value;
                    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                              (&iutest_ar,(internal *)"\"test\"",
                               "::iutest::TestEnv::stream_result_to().c_str()","test",_targc,
                               (char *)&iutest_type_traits::enabler_t<void>::value,
                               in_stack_fffffffffffffd68);
                    std::__cxx11::string::~string((string *)&targc);
                    if (iutest_ar.m_result == false) {
                      memset((iu_global_format_stringstream *)&targc,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                      iutest::detail::iuCodeMessage::iuCodeMessage
                                (&local_268,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xc1,iutest_ar.m_message._M_dataplus._M_p);
                      local_268._44_4_ = 1;
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&local_268,(Fixed *)&targc);
                      std::__cxx11::string::~string((string *)&local_268);
                      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                    }
                    std::__cxx11::string::~string((string *)&iutest_ar);
                    iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(0x4000);
                    iutest_ar.m_message._M_string_length = 0;
                    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
                    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (!iutest_ar.m_result) {
                      memset((iu_global_format_stringstream *)&targc,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)targv,(internal *)&iutest_ar,
                                 (AssertionResult *)
                                 "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::VERBOSE)",
                                 "false","true",(char *)pRVar9);
                      iutest::detail::iuCodeMessage::iuCodeMessage
                                (&local_268,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xc3,targv[0]);
                      local_268._44_4_ = 1;
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&local_268,(Fixed *)&targc);
                      std::__cxx11::string::~string((string *)&local_268);
                      std::__cxx11::string::~string((string *)targv);
                      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&targc);
                    }
                    std::__cxx11::string::~string((string *)&iutest_ar);
                    pUVar5 = iutest::UnitTest::instance();
                    bVar2 = iutest::UnitTest::Failed(pUVar5);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&targc_1);
                    if (!bVar2) {
                      _targc_1 = (pointer)0x0;
                      pbStack_210 = (pointer)0x0;
                      local_208 = (pointer)0x0;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&targc,"--gtest_break_on_failure=1",
                                 (allocator<char> *)&local_268);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&targc_1,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targc);
                      std::__cxx11::string::~string((string *)&targc);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&targc,"--gtest_throw_on_failure=t",
                                 (allocator<char> *)&local_268);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&targc_1,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targc);
                      std::__cxx11::string::~string((string *)&targc);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&targc,"--gtest_also_run_disabled_tests",
                                 (allocator<char> *)&local_268);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&targc_1,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targc);
                      std::__cxx11::string::~string((string *)&targc);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&targc,"--gtest_catch_exceptions=yes",
                                 (allocator<char> *)&local_268);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&targc_1,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targc);
                      std::__cxx11::string::~string((string *)&targc);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&targc,"--gtest_print_time=n",
                                 (allocator<char> *)&local_268);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&targc_1,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targc);
                      std::__cxx11::string::~string((string *)&targc);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&targc,"--gtest_shuffle",(allocator<char> *)&local_268);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&targc_1,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targc);
                      std::__cxx11::string::~string((string *)&targc);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&targc,"--gtest_color=ansi",(allocator<char> *)&local_268
                                );
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&targc_1,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targc);
                      std::__cxx11::string::~string((string *)&targc);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&targc,"--gtest_file_location=gcc",
                                 (allocator<char> *)&local_268);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&targc_1,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targc);
                      std::__cxx11::string::~string((string *)&targc);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&targc,"--gtest_random_seed=200",
                                 (allocator<char> *)&local_268);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&targc_1,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targc);
                      std::__cxx11::string::~string((string *)&targc);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&targc,"--gtest_repeat=2",(allocator<char> *)&local_268);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&targc_1,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targc);
                      std::__cxx11::string::~string((string *)&targc);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&targc,"--gtest_filter=Flag*",
                                 (allocator<char> *)&local_268);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&targc_1,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targc);
                      std::__cxx11::string::~string((string *)&targc);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&targc,"--iutest_default_package_name=",
                                 (allocator<char> *)&local_268);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&targc_1,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targc);
                      std::__cxx11::string::~string((string *)&targc);
                      iutest::InitIrisUnitTest<char>
                                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&targc_1);
                      local_268.m_message._M_dataplus._M_p._0_4_ = 0;
                      _targc = (pointer)((long)pbStack_210 - (long)_targc_1 >> 5);
                      iutest::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                                (&iutest_ar,(internal *)0x12764e,"vargv.size()",(char *)&local_268,
                                 (uint *)&targc,(unsigned_long *)pRVar9);
                      if (iutest_ar.m_result == false) {
                        memset((iu_global_format_stringstream *)&targc,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                        iutest::detail::iuCodeMessage::iuCodeMessage
                                  (&local_268,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xd7,iutest_ar.m_message._M_dataplus._M_p);
                        local_268._44_4_ = 1;
                        iutest::AssertionHelper::operator=
                                  ((AssertionHelper *)&local_268,(Fixed *)&targc);
                        std::__cxx11::string::~string((string *)&local_268);
                        iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                      }
                      std::__cxx11::string::~string((string *)&iutest_ar);
                      iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(2);
                      iutest_ar.m_message._M_string_length = 0;
                      iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
                      iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
                      if (!iutest_ar.m_result) {
                        memset((iu_global_format_stringstream *)&targc,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                  ((string *)targv,(internal *)&iutest_ar,
                                   (AssertionResult *)"IUTEST_FLAG_GET(also_run_disabled_tests)",
                                   "false","true",(char *)pRVar9);
                        iutest::detail::iuCodeMessage::iuCodeMessage
                                  (&local_268,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xd9,targv[0]);
                        local_268._44_4_ = 1;
                        iutest::AssertionHelper::operator=
                                  ((AssertionHelper *)&local_268,(Fixed *)&targc);
                        std::__cxx11::string::~string((string *)&local_268);
                        std::__cxx11::string::~string((string *)targv);
                        iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                      }
                      std::__cxx11::string::~string((string *)&iutest_ar);
                      iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(0x10);
                      iutest_ar.m_message._M_string_length = 0;
                      iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
                      iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
                      if (!iutest_ar.m_result) {
                        memset((iu_global_format_stringstream *)&targc,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                  ((string *)targv,(internal *)&iutest_ar,
                                   (AssertionResult *)"IUTEST_FLAG_GET(break_on_failure)","false",
                                   "true",(char *)pRVar9);
                        iutest::detail::iuCodeMessage::iuCodeMessage
                                  (&local_268,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xda,targv[0]);
                        local_268._44_4_ = 1;
                        iutest::AssertionHelper::operator=
                                  ((AssertionHelper *)&local_268,(Fixed *)&targc);
                        std::__cxx11::string::~string((string *)&local_268);
                        std::__cxx11::string::~string((string *)targv);
                        iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                      }
                      std::__cxx11::string::~string((string *)&iutest_ar);
                      iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(0x40);
                      iutest_ar.m_message._M_string_length = 0;
                      iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
                      iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
                      if (!iutest_ar.m_result) {
                        memset((iu_global_format_stringstream *)&targc,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                  ((string *)targv,(internal *)&iutest_ar,
                                   (AssertionResult *)"IUTEST_FLAG_GET(throw_on_failure)","false",
                                   "true",(char *)pRVar9);
                        iutest::detail::iuCodeMessage::iuCodeMessage
                                  (&local_268,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xdb,targv[0]);
                        local_268._44_4_ = 1;
                        iutest::AssertionHelper::operator=
                                  ((AssertionHelper *)&local_268,(Fixed *)&targc);
                        std::__cxx11::string::~string((string *)&local_268);
                        std::__cxx11::string::~string((string *)targv);
                        iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                      }
                      std::__cxx11::string::~string((string *)&iutest_ar);
                      iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(0x30000);
                      iutest_ar.m_message._M_string_length = 0;
                      iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
                      iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
                      if (!iutest_ar.m_result) {
                        memset((iu_global_format_stringstream *)&targc,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                  ((string *)targv,(internal *)&iutest_ar,
                                   (AssertionResult *)"IUTEST_FLAG_GET(catch_exceptions)","false",
                                   "true",(char *)pRVar9);
                        iutest::detail::iuCodeMessage::iuCodeMessage
                                  (&local_268,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xdc,targv[0]);
                        local_268._44_4_ = 1;
                        iutest::AssertionHelper::operator=
                                  ((AssertionHelper *)&local_268,(Fixed *)&targc);
                        std::__cxx11::string::~string((string *)&local_268);
                        std::__cxx11::string::~string((string *)targv);
                        iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                      }
                      std::__cxx11::string::~string((string *)&iutest_ar);
                      bVar2 = iutest::TestFlag::IsEnableFlag(0x1000);
                      iutest_ar.m_message._M_string_length = 0;
                      iutest_ar.m_result = !bVar2;
                      iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
                      iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
                      if (bVar2) {
                        memset((iu_global_format_stringstream *)&targc,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                  ((string *)targv,(internal *)&iutest_ar,
                                   (AssertionResult *)"IUTEST_FLAG_GET(print_time)","true","false",
                                   (char *)pRVar9);
                        iutest::detail::iuCodeMessage::iuCodeMessage
                                  (&local_268,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xdd,targv[0]);
                        local_268._44_4_ = 1;
                        iutest::AssertionHelper::operator=
                                  ((AssertionHelper *)&local_268,(Fixed *)&targc);
                        std::__cxx11::string::~string((string *)&local_268);
                        std::__cxx11::string::~string((string *)targv);
                        iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                      }
                      std::__cxx11::string::~string((string *)&iutest_ar);
                      uVar7 = 1;
                      iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(1);
                      iutest_ar.m_message._M_string_length = 0;
                      iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
                      iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
                      if (!iutest_ar.m_result) {
                        memset((iu_global_format_stringstream *)&targc,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                  ((string *)targv,(internal *)&iutest_ar,
                                   (AssertionResult *)"IUTEST_FLAG_GET(shuffle)","false","true",
                                   (char *)pRVar9);
                        iutest::detail::iuCodeMessage::iuCodeMessage
                                  (&local_268,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xde,targv[0]);
                        local_268._44_4_ = 1;
                        iutest::AssertionHelper::operator=
                                  ((AssertionHelper *)&local_268,(Fixed *)&targc);
                        std::__cxx11::string::~string((string *)&local_268);
                        std::__cxx11::string::~string((string *)targv);
                        iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                      }
                      std::__cxx11::string::~string((string *)&iutest_ar);
                      bVar2 = iutest::TestFlag::IsEnableFlag(0x2000);
                      iutest_ar.m_message._M_string_length = 0;
                      iutest_ar.m_result = !bVar2;
                      iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
                      iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
                      if (bVar2) {
                        memset((iu_global_format_stringstream *)&targc,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                  ((string *)targv,(internal *)&iutest_ar,
                                   (AssertionResult *)"IUTEST_FLAG_GET(file_location_style_msvc)",
                                   "true","false",(char *)pRVar9);
                        iutest::detail::iuCodeMessage::iuCodeMessage
                                  (&local_268,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xdf,targv[0]);
                        local_268._44_4_ = 1;
                        iutest::AssertionHelper::operator=
                                  ((AssertionHelper *)&local_268,(Fixed *)&targc);
                        std::__cxx11::string::~string((string *)&local_268);
                        std::__cxx11::string::~string((string *)targv);
                        iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                      }
                      std::__cxx11::string::~string((string *)&iutest_ar);
                      targc = 200;
                      iutest::internal::CmpHelperEQ<unsigned_int,iutest::TestEnv::RandomSeedSet>
                                (&iutest_ar,(internal *)"200u","::iutest::TestEnv::random_seed()",
                                 (char *)&targc,(uint *)&local_268,(RandomSeedSet *)pRVar9);
                      if (iutest_ar.m_result == false) {
                        memset((iu_global_format_stringstream *)&targc,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                        iutest::detail::iuCodeMessage::iuCodeMessage
                                  (&local_268,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xe1,iutest_ar.m_message._M_dataplus._M_p);
                        local_268._44_4_ = 1;
                        iutest::AssertionHelper::operator=
                                  ((AssertionHelper *)&local_268,(Fixed *)&targc);
                        std::__cxx11::string::~string((string *)&local_268);
                        iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                      }
                      std::__cxx11::string::~string((string *)&iutest_ar);
                      targc = 2;
                      iutest::internal::CmpHelperEQ<int,iutest::TestEnv::RepeatCountSet>
                                (&iutest_ar,(internal *)0x127886,"::iutest::TestEnv::repeat()",
                                 (char *)&targc,(int *)&local_268,pRVar9);
                      if (iutest_ar.m_result == false) {
                        memset((iu_global_format_stringstream *)&targc,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                        iutest::detail::iuCodeMessage::iuCodeMessage
                                  (&local_268,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xe2,iutest_ar.m_message._M_dataplus._M_p);
                        local_268._44_4_ = 1;
                        iutest::AssertionHelper::operator=
                                  ((AssertionHelper *)&local_268,(Fixed *)&targc);
                        std::__cxx11::string::~string((string *)&local_268);
                        iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                      }
                      std::__cxx11::string::~string((string *)&iutest_ar);
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                      ::OptionString((OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                                      *)&targc);
                      iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                                (&iutest_ar,(internal *)"\"ansi\"",
                                 "::iutest::TestEnv::color().c_str()","ansi",_targc,
                                 (char *)&iutest_type_traits::enabler_t<void>::value,
                                 in_stack_fffffffffffffd68);
                      std::__cxx11::string::~string((string *)&targc);
                      if (iutest_ar.m_result == false) {
                        memset((iu_global_format_stringstream *)&targc,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                        iutest::detail::iuCodeMessage::iuCodeMessage
                                  (&local_268,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xe4,iutest_ar.m_message._M_dataplus._M_p);
                        local_268._44_4_ = 1;
                        iutest::AssertionHelper::operator=
                                  ((AssertionHelper *)&local_268,(Fixed *)&targc);
                        std::__cxx11::string::~string((string *)&local_268);
                        iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                      }
                      std::__cxx11::string::~string((string *)&iutest_ar);
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                      ::OptionString((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                                      *)&targc);
                      iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                                (&iutest_ar,(internal *)"\"Flag*\"",
                                 "::iutest::TestEnv::filter().c_str()","Flag*",_targc,
                                 (char *)&iutest_type_traits::enabler_t<void>::value,
                                 in_stack_fffffffffffffd68);
                      std::__cxx11::string::~string((string *)&targc);
                      if (iutest_ar.m_result == false) {
                        memset((iu_global_format_stringstream *)&targc,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                        iutest::detail::iuCodeMessage::iuCodeMessage
                                  (&local_268,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xe5,iutest_ar.m_message._M_dataplus._M_p);
                        local_268._44_4_ = 1;
                        iutest::AssertionHelper::operator=
                                  ((AssertionHelper *)&local_268,(Fixed *)&targc);
                        std::__cxx11::string::~string((string *)&local_268);
                        iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                      }
                      std::__cxx11::string::~string((string *)&iutest_ar);
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
                      ::OptionString((OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
                                      *)&targc);
                      puVar8 = &iutest_type_traits::enabler_t<void>::value;
                      iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                                (&iutest_ar,(internal *)"\"\"",
                                 "::iutest::TestEnv::default_package_name().c_str()","",_targc,
                                 (char *)&iutest_type_traits::enabler_t<void>::value,
                                 in_stack_fffffffffffffd68);
                      std::__cxx11::string::~string((string *)&targc);
                      if (iutest_ar.m_result == false) {
                        memset((iu_global_format_stringstream *)&targc,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                        iutest::detail::iuCodeMessage::iuCodeMessage
                                  (&local_268,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xe6,iutest_ar.m_message._M_dataplus._M_p);
                        local_268._44_4_ = 1;
                        iutest::AssertionHelper::operator=
                                  ((AssertionHelper *)&local_268,(Fixed *)&targc);
                        std::__cxx11::string::~string((string *)&local_268);
                        iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)&targc);
                      }
                      std::__cxx11::string::~string((string *)&iutest_ar);
                      pUVar5 = iutest::UnitTest::instance();
                      bVar2 = iutest::UnitTest::Failed(pUVar5);
                      if (!bVar2) {
                        pVVar6 = iutest::TestEnv::get_vars();
                        uVar7 = (uint)local_1fa;
                        pVVar6->m_repeat_count = 1;
                      }
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&targc_1);
                      if (!bVar2) {
                        targv[0] = (char *)0x0;
                        targv[1] = (char *)0x0;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&targc,"--iutest_color=off",
                                   (allocator<char> *)&local_268);
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<std::__cxx11::string>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)targv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&targc);
                        std::__cxx11::string::~string((string *)&targc);
                        iutest::InitIrisUnitTest<char>
                                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)targv);
                        local_268.m_message._M_dataplus._M_p._0_4_ = 0;
                        _targc = (pointer)((long)targv[1] - (long)targv[0] >> 5);
                        iutest::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                                  (&iutest_ar,(internal *)0x12764e,"vargv.size()",(char *)&local_268
                                   ,(uint *)&targc,puVar8);
                        if (iutest_ar.m_result == false) {
                          memset((iu_global_format_stringstream *)&targc,0,0x188);
                          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                    ((iu_global_format_stringstream *)&targc);
                          iutest::detail::iuCodeMessage::iuCodeMessage
                                    (&local_268,
                                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                     ,0xf1,iutest_ar.m_message._M_dataplus._M_p);
                          local_268._44_4_ = 1;
                          iutest::AssertionHelper::operator=
                                    ((AssertionHelper *)&local_268,(Fixed *)&targc);
                          std::__cxx11::string::~string((string *)&local_268);
                          iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                    ((iu_global_format_stringstream *)&targc);
                        }
                        std::__cxx11::string::~string((string *)&iutest_ar);
                        iutest::TestEnv::
                        OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                        ::OptionString((OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                                        *)&targc);
                        puVar8 = &iutest_type_traits::enabler_t<void>::value;
                        iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                                  (&iutest_ar,(internal *)"\"no\"",
                                   "::iutest::TestEnv::color().c_str()","no",_targc,
                                   (char *)&iutest_type_traits::enabler_t<void>::value,
                                   in_stack_fffffffffffffd68);
                        std::__cxx11::string::~string((string *)&targc);
                        if (iutest_ar.m_result == false) {
                          memset((iu_global_format_stringstream *)&targc,0,0x188);
                          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                    ((iu_global_format_stringstream *)&targc);
                          iutest::detail::iuCodeMessage::iuCodeMessage
                                    (&local_268,
                                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                     ,0xf2,iutest_ar.m_message._M_dataplus._M_p);
                          local_268._44_4_ = 1;
                          iutest::AssertionHelper::operator=
                                    ((AssertionHelper *)&local_268,(Fixed *)&targc);
                          std::__cxx11::string::~string((string *)&local_268);
                          iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                    ((iu_global_format_stringstream *)&targc);
                        }
                        std::__cxx11::string::~string((string *)&iutest_ar);
                        pUVar4 = iutest::UnitTestSource::GetInstance();
                        iVar3 = iutest::UnitTestSource::Run(pUVar4);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)targv);
                        uVar7 = 1;
                        if (iVar3 == 0) {
                          targv[0] = (char *)0x0;
                          targv[1] = (char *)0x0;
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&targc,"--iutest_color=1",
                                     (allocator<char> *)&local_268);
                          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                          emplace_back<std::__cxx11::string>
                                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)targv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&targc);
                          std::__cxx11::string::~string((string *)&targc);
                          iutest::InitIrisUnitTest<char>
                                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)targv);
                          local_268.m_message._M_dataplus._M_p._0_4_ = 0;
                          _targc = (pointer)((long)targv[1] - (long)targv[0] >> 5);
                          iutest::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                                    (&iutest_ar,(internal *)0x12764e,"vargv.size()",
                                     (char *)&local_268,(uint *)&targc,puVar8);
                          if (iutest_ar.m_result == false) {
                            memset((iu_global_format_stringstream *)&targc,0,0x188);
                            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                      ((iu_global_format_stringstream *)&targc);
                            iutest::detail::iuCodeMessage::iuCodeMessage
                                      (&local_268,
                                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                       ,0xfa,iutest_ar.m_message._M_dataplus._M_p);
                            local_268._44_4_ = 1;
                            iutest::AssertionHelper::operator=
                                      ((AssertionHelper *)&local_268,(Fixed *)&targc);
                            std::__cxx11::string::~string((string *)&local_268);
                            iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                      ((iu_global_format_stringstream *)&targc);
                          }
                          std::__cxx11::string::~string((string *)&iutest_ar);
                          iutest::TestEnv::
                          OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                          ::OptionString((OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                                          *)&targc);
                          puVar8 = &iutest_type_traits::enabler_t<void>::value;
                          iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                                    (&iutest_ar,(internal *)"\"yes\"",
                                     "::iutest::TestEnv::color().c_str()","yes",_targc,
                                     (char *)&iutest_type_traits::enabler_t<void>::value,
                                     in_stack_fffffffffffffd68);
                          std::__cxx11::string::~string((string *)&targc);
                          if (iutest_ar.m_result == false) {
                            memset((iu_global_format_stringstream *)&targc,0,0x188);
                            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                      ((iu_global_format_stringstream *)&targc);
                            iutest::detail::iuCodeMessage::iuCodeMessage
                                      (&local_268,
                                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                       ,0xfb,iutest_ar.m_message._M_dataplus._M_p);
                            local_268._44_4_ = 1;
                            iutest::AssertionHelper::operator=
                                      ((AssertionHelper *)&local_268,(Fixed *)&targc);
                            std::__cxx11::string::~string((string *)&local_268);
                            iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                      ((iu_global_format_stringstream *)&targc);
                          }
                          std::__cxx11::string::~string((string *)&iutest_ar);
                          pUVar4 = iutest::UnitTestSource::GetInstance();
                          iVar3 = iutest::UnitTestSource::Run(pUVar4);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)targv);
                          if (iVar3 == 0) {
                            targv[0] = (char *)0x0;
                            targv[1] = (char *)0x0;
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&targc,"--iutest_color=auto",
                                       (allocator<char> *)&local_268);
                            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                            emplace_back<std::__cxx11::string>
                                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                        *)targv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)&targc);
                            std::__cxx11::string::~string((string *)&targc);
                            iutest::InitIrisUnitTest<char>
                                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)targv);
                            local_268.m_message._M_dataplus._M_p._0_4_ = 0;
                            _targc = (pointer)((long)targv[1] - (long)targv[0] >> 5);
                            iutest::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                                      (&iutest_ar,(internal *)0x12764e,"vargv.size()",
                                       (char *)&local_268,(uint *)&targc,puVar8);
                            if (iutest_ar.m_result == false) {
                              memset((iu_global_format_stringstream *)&targc,0,0x188);
                              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                        ((iu_global_format_stringstream *)&targc);
                              iutest::detail::iuCodeMessage::iuCodeMessage
                                        (&local_268,
                                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                         ,0x103,iutest_ar.m_message._M_dataplus._M_p);
                              local_268._44_4_ = 1;
                              iutest::AssertionHelper::operator=
                                        ((AssertionHelper *)&local_268,(Fixed *)&targc);
                              std::__cxx11::string::~string((string *)&local_268);
                              iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                        ((iu_global_format_stringstream *)&targc);
                            }
                            std::__cxx11::string::~string((string *)&iutest_ar);
                            iutest::TestEnv::
                            OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                            ::OptionString((OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                                            *)&targc);
                            iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                                      (&iutest_ar,(internal *)"\"auto\"",
                                       "::iutest::TestEnv::color().c_str()","auto",_targc,
                                       (char *)&iutest_type_traits::enabler_t<void>::value,
                                       in_stack_fffffffffffffd68);
                            std::__cxx11::string::~string((string *)&targc);
                            if (iutest_ar.m_result == false) {
                              memset((iu_global_format_stringstream *)&targc,0,0x188);
                              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                        ((iu_global_format_stringstream *)&targc);
                              iutest::detail::iuCodeMessage::iuCodeMessage
                                        (&local_268,
                                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                         ,0x104,iutest_ar.m_message._M_dataplus._M_p);
                              local_268._44_4_ = 1;
                              iutest::AssertionHelper::operator=
                                        ((AssertionHelper *)&local_268,(Fixed *)&targc);
                              std::__cxx11::string::~string((string *)&local_268);
                              iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                        ((iu_global_format_stringstream *)&targc);
                            }
                            std::__cxx11::string::~string((string *)&iutest_ar);
                            pUVar4 = iutest::UnitTestSource::GetInstance();
                            iVar3 = iutest::UnitTestSource::Run(pUVar4);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)targv);
                            if (iVar3 == 0) {
                              puts("*** Successful ***");
                              uVar7 = 0;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar7;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
    (void)argc;
#if defined(DISABLE_FALSE_POSITIVE_XML)
    // 実行対象テストがないので xml 出力しない
    ::iuutil::ReleaseDefaultXmlGenerator();
#endif

#if !defined(IUTEST_USE_GTEST) && IUTEST_HAS_NULLPTR
    {
        int targc = 0;
        IUTEST_INIT(&targc, nullptr);
    }
#endif

    {
        int targc = 2;
        DECAL_ARGV("--help");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(1, targc);
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
#if !defined(IUTEST_USE_GTEST)
    {
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP));

        int targc = 2;
        DECAL_ARGV("--version");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(1, targc);
        IUTEST_EXPECT_NE( "no", IUTEST_FLAG_GET(color) );
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_VERSION));

        int targc = 2;
        DECAL_ARGV("--feature");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(1, targc);
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE));

        int targc = 2;
        DECAL_ARGV("--spec");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(1, targc);
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_SPEC));
        int targc = 4;
        const iutest::detail::iu_tchar* targv[] = { argv[0], IU_TSTR("test1"), IU_TSTR("-v"), IU_TSTR("test2") };
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(3, targc);
        IUTEST_EXPECT_STREQ(IU_TSTR("test1"), targv[1]);
        IUTEST_EXPECT_STREQ(IU_TSTR("test2"), targv[2]);
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        ::std::vector< ::std::string > vargv;
        vargv.push_back("test1");
        vargv.push_back("-v");
        vargv.push_back("test2");
        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(2u, vargv.size());
        IUTEST_EXPECT_STREQ("test1", vargv[0]);
        IUTEST_EXPECT_STREQ("test2", vargv[1]);
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }

    {
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_VERSION));

        int targc = 2;
        DECAL_ARGV("-h");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(1, targc);
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP));

        int targc = 2;
        DECAL_ARGV("-?");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(1, targc);
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }

    {
        const bool file_location_msvc = IUTEST_FLAG_GET(file_location_style_msvc);
        IUTEST_FLAG_SET(file_location_style_msvc, !file_location_msvc);

        ::std::vector< ::std::string > vargv;
        vargv.push_back("--iutest_break_on_failure");
        vargv.push_back("--iutest_throw_on_failure");
        vargv.push_back("--iutest_filter");
        vargv.push_back("--iutest_file_location=auto");
        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(0u, vargv.size());

        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(break_on_failure) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(throw_on_failure) );
        IUTEST_EXPECT_STREQ( "*", IUTEST_FLAG_GET(filter).c_str() );
        IUTEST_EXPECT_EQ   ( file_location_msvc, IUTEST_FLAG_GET(file_location_style_msvc) );

        if( ::iutest::UnitTest::GetInstance()->Failed() ) return 1;
    }

    {
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP));
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE));
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_VERSION));

        ::std::vector< ::std::string > vargv;
        vargv.push_back("--iutest_break_on_failure=1");
        vargv.push_back("--iutest_throw_on_failure=t");
        vargv.push_back("--iutest_also_run_disabled_tests");
        vargv.push_back("--iutest_catch_exceptions=yes");
        vargv.push_back("--iutest_print_time=n");
        vargv.push_back("--iutest_shuffle");
        vargv.push_back("--iutest_color=ansi");
        vargv.push_back("--iutest_file_location=vs");
        vargv.push_back("--iutest_random_seed=200");
        vargv.push_back("--iutest_repeat=2");
        vargv.push_back("--iutest_filter=Flag*");
        vargv.push_back("--iutest_default_package_name=root");
        vargv.push_back("--iutest_warning_into_error=t");
        vargv.push_back("--iutest_locale_ctype=C");
#if IUTEST_HAS_STREAM_RESULT
        vargv.push_back("--iutest_stream_result_to=test");
#endif
        vargv.push_back("--verbose");

        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(0u, vargv.size());

        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(also_run_disabled_tests) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(break_on_failure) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(throw_on_failure) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(catch_exceptions) );
        IUTEST_EXPECT_FALSE( IUTEST_FLAG_GET(print_time) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(shuffle) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(file_location_style_msvc) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(warning_into_error) );

        IUTEST_EXPECT_EQ( 200u, IUTEST_FLAG_GET(random_seed) );
        IUTEST_EXPECT_EQ(   2 , IUTEST_FLAG_GET(repeat) );

        IUTEST_EXPECT_STREQ( "ansi", IUTEST_FLAG_GET(color).c_str() );
        IUTEST_EXPECT_STREQ( "Flag*", IUTEST_FLAG_GET(filter).c_str() );
        IUTEST_EXPECT_STREQ( "root", IUTEST_FLAG_GET(default_package_name).c_str() );
        IUTEST_EXPECT_STREQ( "C", IUTEST_FLAG_GET(locale_ctype).c_str() );
#if IUTEST_HAS_STREAM_RESULT
        IUTEST_EXPECT_STREQ( "test", IUTEST_FLAG_GET(stream_result_to).c_str() );
#endif
        IUTEST_EXPECT_TRUE (::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::VERBOSE));

        if( ::iutest::UnitTest::GetInstance()->Failed() ) return 1;
    }

    {
        ::std::vector< ::std::string > vargv;
        vargv.push_back("--gtest_break_on_failure=1");
        vargv.push_back("--gtest_throw_on_failure=t");
        vargv.push_back("--gtest_also_run_disabled_tests");
        vargv.push_back("--gtest_catch_exceptions=yes");
        vargv.push_back("--gtest_print_time=n");
        vargv.push_back("--gtest_shuffle");
        vargv.push_back("--gtest_color=ansi");
        vargv.push_back("--gtest_file_location=gcc");
        vargv.push_back("--gtest_random_seed=200");
        vargv.push_back("--gtest_repeat=2");
        vargv.push_back("--gtest_filter=Flag*");
        vargv.push_back("--iutest_default_package_name=");
        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(0u, vargv.size());

        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(also_run_disabled_tests) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(break_on_failure) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(throw_on_failure) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(catch_exceptions) );
        IUTEST_EXPECT_FALSE( IUTEST_FLAG_GET(print_time) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(shuffle) );
        IUTEST_EXPECT_FALSE( IUTEST_FLAG_GET(file_location_style_msvc) );

        IUTEST_EXPECT_EQ( 200u, IUTEST_FLAG_GET(random_seed) );
        IUTEST_EXPECT_EQ(   2 , IUTEST_FLAG_GET(repeat) );

        IUTEST_EXPECT_STREQ( "ansi", IUTEST_FLAG_GET(color).c_str() );
        IUTEST_EXPECT_STREQ( "Flag*", IUTEST_FLAG_GET(filter).c_str() );
        IUTEST_EXPECT_STREQ( "", IUTEST_FLAG_GET(default_package_name).c_str() );

        if( ::iutest::UnitTest::GetInstance()->Failed() ) return 1;

        IUTEST_FLAG_SET(repeat, 1);
    }

    {
        ::std::vector< ::std::string > vargv;
        vargv.push_back("--iutest_color=off");
        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(0u, vargv.size());
        IUTEST_EXPECT_STREQ( "no", IUTEST_FLAG_GET(color).c_str() );

        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        ::std::vector< ::std::string > vargv;
        vargv.push_back("--iutest_color=1");
        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(0u, vargv.size());
        IUTEST_EXPECT_STREQ( "yes", IUTEST_FLAG_GET(color).c_str() );

        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        ::std::vector< ::std::string > vargv;
        vargv.push_back("--iutest_color=auto");
        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(0u, vargv.size());
        IUTEST_EXPECT_STREQ( "auto", IUTEST_FLAG_GET(color).c_str() );

        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
#endif
    printf("*** Successful ***\n");
    return 0;
}